

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpivotL.c
# Opt level: O2

int cpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 uVar1;
  int iVar2;
  int_t iVar3;
  flops_t *pfVar4;
  void *pvVar5;
  int_t *piVar6;
  double dVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  singlecomplex *z;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  singlecomplex temp;
  singlecomplex one;
  
  one.r = 1.0;
  one.i = 0.0;
  pfVar4 = stat->ops;
  pvVar5 = Glu->lusup;
  iVar2 = Glu->xsup[Glu->supno[jcol]];
  iVar17 = jcol - iVar2;
  iVar10 = Glu->xlsub[iVar2];
  iVar14 = Glu->xlsub[(long)iVar2 + 1] - iVar10;
  iVar2 = Glu->xlusup[iVar2];
  lVar13 = (long)Glu->xlusup[jcol];
  piVar6 = Glu->lsub;
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  iVar8 = iperm_c[jcol];
  uVar15 = (ulong)iVar17;
  z = (singlecomplex *)(uVar15 * 8 + lVar13 * 8 + (long)pvVar5);
  uVar11 = 0xffffffffffffffff;
  iVar18 = iVar17;
  iVar12 = iVar17;
  fVar20 = 0.0;
  for (uVar16 = uVar15; (long)uVar16 < (long)iVar14; uVar16 = uVar16 + 1) {
    dVar7 = c_abs1(z);
    fVar19 = (float)dVar7;
    if (fVar20 < fVar19) {
      iVar18 = (int)uVar16;
    }
    if ((*usepr != 0) && (piVar6[(long)iVar10 + uVar16] == *pivrow)) {
      iVar12 = (int)uVar16;
    }
    if (piVar6[(long)iVar10 + uVar16] == iVar8) {
      uVar11 = uVar16;
    }
    uVar11 = uVar11 & 0xffffffff;
    if (fVar19 <= fVar20) {
      fVar19 = fVar20;
    }
    z = z + 1;
    fVar20 = fVar19;
  }
  if ((fVar20 == 0.0) && (!NAN(fVar20))) {
    *usepr = 0;
    return jcol + 1;
  }
  if (*usepr != 0) {
    dVar7 = c_abs1((singlecomplex *)((long)pvVar5 + (long)iVar12 * 8 + lVar13 * 8));
    fVar19 = (float)dVar7;
    if (((fVar19 == 0.0) && (!NAN(fVar19))) || (fVar19 < (float)((double)fVar20 * u))) {
      *usepr = 0;
    }
    else {
      iVar18 = iVar12;
      if (*usepr != 0) {
        iVar8 = *pivrow;
        goto LAB_001097fa;
      }
    }
  }
  iVar12 = iVar18;
  if ((-1 < (int)uVar11) &&
     (dVar7 = c_abs1((singlecomplex *)((long)pvVar5 + (uVar11 & 0xffffffff) * 8 + lVar13 * 8)),
     (float)dVar7 != 0.0 && (float)((double)fVar20 * u) <= (float)dVar7)) {
    iVar12 = (int)uVar11;
  }
  iVar8 = piVar6[(long)iVar10 + (long)iVar12];
  *pivrow = iVar8;
LAB_001097fa:
  perm_r[iVar8] = jcol;
  if (iVar12 != iVar17) {
    iVar3 = piVar6[(long)iVar10 + (long)iVar12];
    piVar6[(long)iVar10 + (long)iVar12] = piVar6[(long)iVar10 + uVar15];
    piVar6[(long)iVar10 + uVar15] = iVar3;
    iVar10 = iVar17;
    for (lVar9 = 0; lVar9 <= (long)uVar15; lVar9 = lVar9 + 1) {
      temp = *(singlecomplex *)((long)pvVar5 + (long)iVar12 * 8 + (long)iVar2 * 8);
      *(undefined8 *)((long)pvVar5 + (long)iVar12 * 8 + (long)iVar2 * 8) =
           *(undefined8 *)((long)pvVar5 + (long)iVar10 * 8 + (long)iVar2 * 8);
      *(singlecomplex *)((long)pvVar5 + (long)iVar10 * 8 + (long)iVar2 * 8) = temp;
      iVar10 = iVar10 + iVar14;
      iVar12 = iVar12 + iVar14;
    }
  }
  pfVar4[7] = (float)((iVar14 - iVar17) * 10) + pfVar4[7];
  c_div(&temp,&one,(singlecomplex *)((long)pvVar5 + uVar15 * 8 + lVar13 * 8));
  while (uVar15 = uVar15 + 1, (long)uVar15 < (long)iVar14) {
    uVar1 = *(undefined8 *)((long)pvVar5 + uVar15 * 8 + lVar13 * 8);
    fVar20 = (float)uVar1;
    fVar19 = (float)((ulong)uVar1 >> 0x20);
    *(ulong *)((long)pvVar5 + uVar15 * 8 + lVar13 * 8) =
         CONCAT44(temp.r * fVar19 + fVar20 * temp.i,temp.r * fVar20 + -fVar19 * temp.i);
  }
  return 0;
}

Assistant:

int
cpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    singlecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    float       pivmax, rtemp, thresh;
    singlecomplex       temp;
    singlecomplex       *lu_sup_ptr; 
    singlecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (singlecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = c_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = c_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = c_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    c_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	cc_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}